

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * __thiscall
Corrade::Utility::String::Implementation::stripPrefix
          (string *__return_storage_ptr__,Implementation *this,string *string,
          ArrayView<const_char> prefix)

{
  ArrayView<const_char> string_00;
  bool bVar1;
  ostream *output;
  size_t unaff_RBX;
  ArrayView<const_char> in_stack_ffffffffffffffd0;
  ostream *in_stack_ffffffffffffffe0;
  
  string_00._size = unaff_RBX;
  string_00._data = (char *)in_stack_ffffffffffffffe0;
  bVar1 = beginsWith(string_00,in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::__cxx11::string::erase((ulong)this,0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
    return __return_storage_ptr__;
  }
  output = Error::defaultOutput();
  Error::Error((Error *)&stack0xffffffffffffffc0,output,(Flags)0x0);
  Debug::operator<<((Debug *)&stack0xffffffffffffffc0,
                    "Utility::String::stripPrefix(): string doesn\'t begin with given prefix");
  Error::~Error((Error *)&stack0xffffffffffffffc0);
  abort();
}

Assistant:

std::string stripPrefix(std::string string, const Containers::ArrayView<const char> prefix) {
    CORRADE_ASSERT(beginsWith({string.data(), string.size()}, prefix),
        "Utility::String::stripPrefix(): string doesn't begin with given prefix", {});
    string.erase(0, prefix.size());
    return string;
}